

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal.cpp
# Opt level: O2

Variable __thiscall LiteScript::String::GetChar(String *this,Memory *memory,uint i)

{
  undefined8 *puVar1;
  Object *pOVar2;
  undefined4 in_ECX;
  undefined4 in_register_00000014;
  Variable VVar3;
  
  Memory::Create((Memory *)this,(Type *)CONCAT44(in_register_00000014,i));
  pOVar2 = Variable::operator->((Variable *)this);
  puVar1 = (undefined8 *)pOVar2->data;
  *puVar1 = memory;
  *(undefined4 *)(puVar1 + 1) = in_ECX;
  *(undefined1 *)(puVar1 + 4) = 1;
  puVar1[5] = puVar1 + 4;
  puVar1[6] = puVar1 + 1;
  VVar3.nb_ref = (uint *)(puVar1 + 4);
  VVar3.obj = (Object *)this;
  return VVar3;
}

Assistant:

LiteScript::Variable LiteScript::String::GetChar(LiteScript::Memory& memory, unsigned int i) {
    Variable result = memory.Create(_type_character);
    std::allocator<Character> allocator;
    allocator.construct(&result->GetData<Character>(), *this, i);
    return result;
}